

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O1

void __thiscall
fizplex::LPTestFeasibility_IsFeasibleForBoundedVarAndRangeRow_Test::TestBody
          (LPTestFeasibility_IsFeasibleForBoundedVarAndRangeRow_Test *this)

{
  LP *this_00;
  long lVar1;
  initializer_list<double> l;
  initializer_list<double> l_00;
  initializer_list<double> l_01;
  initializer_list<fizplex::DVector> __l;
  initializer_list<double> l_02;
  initializer_list<double> l_03;
  initializer_list<fizplex::DVector> __l_00;
  allocator_type local_b9;
  vector<fizplex::DVector,_std::allocator<fizplex::DVector>_> local_b8;
  DVector local_a0;
  DVector local_88;
  DVector local_70;
  double local_58 [2];
  undefined1 *local_48;
  undefined8 uStack_40;
  double local_38 [3];
  
  this_00 = &(this->super_LPTestFeasibility).lp;
  LP::add_column(this_00,Bounded,-1.0,5.0,0.0);
  LP::add_row(this_00,Range,-3.0,7.0);
  LP::add_value(this_00,0,0,2.0);
  LP::add_logicals(this_00);
  local_38[0] = 0.0;
  local_38[1] = 7.0;
  l._M_len = 2;
  l._M_array = local_38;
  DVector::DVector(&local_a0,l);
  local_48 = &DAT_bff0000000000000;
  uStack_40 = 0x4022000000000000;
  l_00._M_len = 2;
  l_00._M_array = (iterator)&local_48;
  DVector::DVector(&local_88,l_00);
  local_58[0] = 3.5;
  local_58[1] = 0.0;
  l_01._M_len = 2;
  l_01._M_array = local_58;
  DVector::DVector(&local_70,l_01);
  __l._M_len = 3;
  __l._M_array = &local_a0;
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::vector(&local_b8,__l,&local_b9);
  LPTestFeasibility::check_feasible(&this->super_LPTestFeasibility,true,&local_b8);
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::~vector(&local_b8);
  lVar1 = 0x48;
  do {
    operator_delete(*(void **)((long)&local_b8.
                                      super__Vector_base<fizplex::DVector,_std::allocator<fizplex::DVector>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != 0);
  local_38[0] = -1.5;
  local_38[1] = 0.0;
  l_02._M_len = 2;
  l_02._M_array = local_38;
  DVector::DVector(&local_a0,l_02);
  local_48 = (undefined1 *)0x4010000000000000;
  uStack_40 = 0;
  l_03._M_len = 2;
  l_03._M_array = (iterator)&local_48;
  DVector::DVector(&local_88,l_03);
  __l_00._M_len = 2;
  __l_00._M_array = &local_a0;
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::vector
            (&local_b8,__l_00,(allocator_type *)local_58);
  LPTestFeasibility::check_feasible(&this->super_LPTestFeasibility,false,&local_b8);
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::~vector(&local_b8);
  lVar1 = 0x30;
  do {
    operator_delete(*(void **)((long)&local_b8.
                                      super__Vector_base<fizplex::DVector,_std::allocator<fizplex::DVector>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != 0);
  return;
}

Assistant:

TEST_F(LPTestFeasibility, IsFeasibleForBoundedVarAndRangeRow) {
  lp.add_column(ColType::Bounded, -1.0, 5);
  lp.add_row(RowType::Range, -3, 7);
  lp.add_value(0, 0, 2.0);
  lp.add_logicals();

  check_feasible(true, {{0, 7}, {-1, 9}, {3.5, 0}});
  check_feasible(false, {{-1.5, 0}, {4, 0}});
}